

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.cpp
# Opt level: O0

uint megumax::select_best_child_index(UCTNode *node)

{
  vector<megumax::UCTNode,_std::allocator<megumax::UCTNode>_> *this;
  size_type sVar1;
  UCTNode *in_RDI;
  double dVar2;
  double dVar3;
  uint i;
  uint best_node_index;
  UCTNode *in_stack_00000028;
  undefined4 local_10;
  undefined4 local_c;
  
  local_c = 0;
  local_10 = 1;
  while( true ) {
    this = UCTNode::children(in_RDI);
    sVar1 = std::vector<megumax::UCTNode,_std::allocator<megumax::UCTNode>_>::size(this);
    if (sVar1 <= local_10) break;
    dVar2 = UCTNode::child_score(in_stack_00000028,(size_t)node);
    dVar3 = UCTNode::child_score(in_stack_00000028,(size_t)node);
    if (dVar3 < dVar2) {
      local_c = local_10;
    }
    local_10 = local_10 + 1;
  }
  return local_c;
}

Assistant:

unsigned select_best_child_index(const UCTNode* node) {
    unsigned best_node_index = 0;
    for (unsigned i = 1; i < node->children().size(); ++i) {
        if (node->child_score(i) > node->child_score(best_node_index)) {
            best_node_index = i;
        }
    }
    return best_node_index;
}